

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_range_join.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalRangeJoin::ProjectResult(PhysicalRangeJoin *this,DataChunk *chunk,DataChunk *result)

{
  pointer puVar1;
  pointer puVar2;
  pointer pLVar3;
  pointer pLVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  long lVar9;
  size_type __n;
  size_type __n_00;
  
  puVar1 = (this->left_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->left_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)puVar1 - (long)puVar2 >> 3;
  if (puVar1 != puVar2) {
    __n = 0;
    do {
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&result->data,__n);
      pvVar6 = vector<unsigned_long,_true>::operator[](&this->left_projection_map,__n);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk->data,*pvVar6);
      Vector::Reference(pvVar5,pvVar7);
      __n = __n + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != __n);
  }
  pvVar8 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.children,0);
  if ((this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pLVar3 = (pvVar8->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar4 = (pvVar8->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    __n_00 = 0;
    do {
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&result->data,lVar9 + __n_00);
      pvVar6 = vector<unsigned_long,_true>::operator[](&this->right_projection_map,__n_00);
      pvVar7 = vector<duckdb::Vector,_true>::operator[]
                         (&chunk->data,
                          *pvVar6 + ((long)pLVar3 - (long)pLVar4 >> 3) * -0x5555555555555555);
      Vector::Reference(pvVar5,pvVar7);
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)(this->right_projection_map).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->right_projection_map).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  result->count = chunk->count;
  return;
}

Assistant:

void PhysicalRangeJoin::ProjectResult(DataChunk &chunk, DataChunk &result) const {
	const auto left_projected = left_projection_map.size();
	for (idx_t i = 0; i < left_projected; ++i) {
		result.data[i].Reference(chunk.data[left_projection_map[i]]);
	}
	const auto left_width = children[0].get().GetTypes().size();
	for (idx_t i = 0; i < right_projection_map.size(); ++i) {
		result.data[left_projected + i].Reference(chunk.data[left_width + right_projection_map[i]]);
	}
	result.SetCardinality(chunk);
}